

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45a12::MapDrivePlugIn::printMiniHelpForFunctionKeys(MapDrivePlugIn *this)

{
  ostream *poVar1;
  char *pcVar2;
  long *in_RDI;
  ostringstream message;
  ostringstream *in_stack_fffffffffffffe70;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,"Function keys handled by ");
  poVar1 = std::operator<<((ostream *)local_180,'\"');
  pcVar2 = (char *)(**(code **)(*in_RDI + 0x38))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,'\"');
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,std::ends<char,std::char_traits<char>>);
  OpenSteer::OpenSteerDemo::printMessage(in_stack_fffffffffffffe70);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f34);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f42);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f50);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f5e);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f6c);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x136f7a);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void printMiniHelpForFunctionKeys (void)
        {
            std::ostringstream message;
            message << "Function keys handled by ";
            message << '"' << name() << '"' << ':' << std::ends;
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage ("  F1     select next driving demo.");
            OpenSteerDemo::printMessage ("  F2     reverse path following direction.");
            OpenSteerDemo::printMessage ("  F3     toggle path fences.");
            OpenSteerDemo::printMessage ("  F4     toggle random rock clumps.");
            OpenSteerDemo::printMessage ("  F5     toggle curved prediction.");
            OpenSteerDemo::printMessage ("");
        }